

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O0

void lysc_module_free(lysf_ctx *ctx,lysc_module *module)

{
  lysc_node *plVar1;
  void *local_50;
  void *local_30;
  uint64_t c__;
  lysc_node *node_next;
  lysc_node *node;
  lysc_module *module_local;
  lysf_ctx *ctx_local;
  
  if (module != (lysc_module *)0x0) {
    node_next = module->data;
    while (node_next != (lysc_node *)0x0) {
      plVar1 = node_next->next;
      lysc_node_free_(ctx,node_next);
      node_next = plVar1;
    }
    node_next = (lysc_node *)module->rpcs;
    while (node_next != (lysc_node *)0x0) {
      plVar1 = node_next->next;
      lysc_node_free_(ctx,node_next);
      node_next = plVar1;
    }
    node_next = (lysc_node *)module->notifs;
    while (node_next != (lysc_node *)0x0) {
      plVar1 = node_next->next;
      lysc_node_free_(ctx,node_next);
      node_next = plVar1;
    }
    local_30 = (void *)0x0;
    while( true ) {
      if (module->exts == (lysc_ext_instance *)0x0) {
        local_50 = (void *)0x0;
      }
      else {
        local_50 = module->exts[-1].compiled;
      }
      if (local_50 <= local_30) break;
      lysc_ext_instance_free(ctx,module->exts + (long)local_30);
      local_30 = (void *)((long)local_30 + 1);
    }
    if (module->exts != (lysc_ext_instance *)0x0) {
      free(&module->exts[-1].compiled);
    }
    free(module);
  }
  return;
}

Assistant:

void
lysc_module_free(struct lysf_ctx *ctx, struct lysc_module *module)
{
    struct lysc_node *node, *node_next;

    if (!module) {
        return;
    }

    LY_LIST_FOR_SAFE(module->data, node_next, node) {
        lysc_node_free_(ctx, node);
    }
    LY_LIST_FOR_SAFE((struct lysc_node *)module->rpcs, node_next, node) {
        lysc_node_free_(ctx, node);
    }
    LY_LIST_FOR_SAFE((struct lysc_node *)module->notifs, node_next, node) {
        lysc_node_free_(ctx, node);
    }
    FREE_ARRAY(ctx, module->exts, lysc_ext_instance_free);

    free(module);
}